

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  invalid_argument *piVar2;
  long lVar3;
  char *__s1;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  exception *e;
  char *libraryVersion;
  char *in_stack_00000088;
  char *in_stack_00000090;
  int i;
  bool verbose;
  float exposure;
  int previewWidth;
  char *outFile;
  char *inFile;
  char *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  int local_30;
  int local_24;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_18 = (char *)0x0;
  local_20 = (char *)0x0;
  local_24 = 100;
  if (in_EDI < 2) {
    usageMessage(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false);
    local_4 = -1;
  }
  else {
    local_30 = 1;
    while (local_30 < in_EDI) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"-w");
      if (iVar1 == 0) {
        if (in_EDI + -2 < local_30) {
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar2,"Missing width for -w argument");
          __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        lVar3 = strtol(*(char **)(in_RSI + (long)(local_30 + 1) * 8),(char **)0x0,0);
        local_24 = (int)lVar3;
        if (local_24 < 1) {
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar2,"preview width must be greater than zero");
          __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        local_30 = local_30 + 2;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"-e");
        if (iVar1 == 0) {
          if (in_EDI + -2 < local_30) {
            piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar2,"missing exposure for -e argument");
            __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          strtod(*(char **)(in_RSI + (long)(local_30 + 1) * 8),(char **)0x0);
          local_30 = local_30 + 2;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"-v");
          if (iVar1 != 0) {
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"-h");
            if ((iVar1 == 0) ||
               (iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"--help"), iVar1 == 0)) {
              usageMessage(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false);
              return 0;
            }
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_30 * 8),"--version");
            if (iVar1 == 0) {
              __s1 = (char *)Imf_3_4::getLibraryVersion();
              poVar4 = std::operator<<((ostream *)&std::cout,"exrmakepreview (OpenEXR) ");
              std::operator<<(poVar4,"3.4.0");
              iVar1 = strcmp(__s1,"3.4.0");
              if (iVar1 != 0) {
                poVar4 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
                poVar4 = std::operator<<(poVar4,__s1);
                std::operator<<(poVar4,")");
              }
              poVar4 = std::operator<<((ostream *)&std::cout," https://openexr.com");
              std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Copyright (c) Contributors to the OpenEXR Project");
              std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
              std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
              return 0;
            }
            if (local_18 == (char *)0x0) {
              local_18 = *(char **)(in_RSI + (long)local_30 * 8);
            }
            else {
              local_20 = *(char **)(in_RSI + (long)local_30 * 8);
            }
          }
          local_30 = local_30 + 1;
        }
      }
    }
    if ((local_18 == (char *)0x0) || (local_20 == (char *)0x0)) {
      usageMessage(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false);
      local_4 = -1;
    }
    else {
      iVar1 = strcmp(local_18,local_20);
      if (iVar1 == 0) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar2,"Input and output cannot be the same file");
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (local_24 < 1) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar2,"Preview image width must be greater than zero");
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      makePreview(in_stack_00000090,in_stack_00000088,libraryVersion._4_4_,libraryVersion._0_4_,
                  e._7_1_);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile       = 0;
    const char* outFile      = 0;
    int         previewWidth = 100;
    float       exposure     = 0;
    bool        verbose      = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-w"))
            {
                //
                // Set preview image width
                //

                if (i > argc - 2)
                    throw invalid_argument ("Missing width for -w argument");

                previewWidth = strtol (argv[i + 1], 0, 0);
                if (previewWidth <= 0)
                    throw invalid_argument (
                        "preview width must be greater than zero");

                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set exposure
                //

                if (i > argc - 2)
                    throw invalid_argument ("missing exposure for -e argument");

                exposure = strtod (argv[i + 1], 0);

                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmakepreview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmakepreview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        if (previewWidth <= 0)
            throw invalid_argument (
                "Preview image width must be greater than zero");

        //
        // Load inFile, add a preview image, and save the result in outFile.
        //

        makePreview (inFile, outFile, previewWidth, exposure, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}